

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

BBox * __thiscall CS248::DynamicScene::Mesh::getBBox(Mesh *this)

{
  float fVar1;
  float fVar2;
  const_reference pvVar3;
  Vector3D *in_RSI;
  BBox *in_RDI;
  Vector4D posObjWorld;
  Vector4D posObj;
  int i;
  BBox *bbox;
  SceneObject *in_stack_00000338;
  BBox *this_00;
  BBox *in_stack_ffffffffffffff10;
  BBox *in_stack_ffffffffffffff50;
  Vector4D *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  
  this_00 = in_RDI;
  BBox::BBox(in_stack_ffffffffffffff50);
  for (iVar4 = 0; SBORROW4(iVar4,*(int *)&in_RSI[3].z * 3) != iVar4 + *(int *)&in_RSI[3].z * -3 < 0;
      iVar4 = iVar4 + 1) {
    pvVar3 = std::
             vector<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
             ::operator[]((vector<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
                           *)(in_RSI + 4),(long)iVar4);
    fVar1 = pvVar3->x;
    pvVar3 = std::
             vector<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
             ::operator[]((vector<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
                           *)(in_RSI + 4),(long)iVar4);
    fVar2 = pvVar3->y;
    pvVar3 = std::
             vector<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
             ::operator[]((vector<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
                           *)(in_RSI + 4),(long)iVar4);
    Vector4D::Vector4D((Vector4D *)&stack0xffffffffffffffc8,(double)fVar1,(double)fVar2,
                       (double)pvVar3->z,1.0);
    SceneObject::getObjectToWorld(in_stack_00000338);
    Matrix4x4::operator*
              ((Matrix4x4 *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
    Vector4D::projectTo3D((Vector4D *)this_00);
    BBox::expand(in_stack_ffffffffffffff10,in_RSI);
  }
  return in_RDI;
}

Assistant:

BBox Mesh::getBBox() const {

	BBox bbox;

	// convert object-space points to world space points, and compute a world-space bounding box
	// NOTE(kayvonf): this is an inefficient implementation since we're considering each unique vertex position up to 3 times 
	for (int i=0; i<3*numTriangles_; ++i) {
		Vector4D posObj(positionData_[i].x, positionData_[i].y, positionData_[i].z, 1.f);
		Vector4D posObjWorld = getObjectToWorld() * posObj;
		bbox.expand(posObjWorld.projectTo3D());
  	}

  	return bbox;
}